

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

int fio_sock_sendfile_from_fd(int fd,fio_packet_s *packet)

{
  uintptr_t *puVar1;
  short *psVar2;
  long lVar3;
  long *ptr;
  fio_data_s *pfVar4;
  ssize_t sVar5;
  long lVar6;
  
  sVar5 = sendfile64(fd,*(int *)&packet->data,(__off64_t *)&packet->offset,packet->length);
  if (sVar5 < 0) {
    sVar5 = 0xffffffff;
  }
  else {
    puVar1 = &packet->length;
    *puVar1 = *puVar1 - sVar5;
    pfVar4 = fio_data;
    if (*puVar1 == 0) {
      lVar6 = (long)fd * 0xa8;
      ptr = *(long **)((long)fio_data + lVar6 + 0x40);
      *(long *)((long)fio_data + lVar6 + 0x40) = *ptr;
      LOCK();
      psVar2 = (short *)((long)pfVar4 + lVar6 + 0x68);
      *psVar2 = *psVar2 + -1;
      pfVar4 = fio_data;
      UNLOCK();
      lVar3 = (long)fio_data + lVar6 + 0x40;
      if (*ptr == 0) {
        *(long *)(lVar3 + 8) = lVar3;
        *(undefined2 *)((long)pfVar4 + lVar6 + 0x68) = 0;
      }
      else if (ptr == *(long **)(lVar3 + 8)) {
        *(long *)(lVar3 + 8) = lVar3;
      }
      (*(code *)ptr[2])(ptr[3]);
      fio_free(ptr);
    }
  }
  return (int)sVar5;
}

Assistant:

static int fio_sock_sendfile_from_fd(int fd, fio_packet_s *packet) {
  ssize_t sent;
  sent =
      sendfile64(fd, packet->data.fd, (off_t *)&packet->offset, packet->length);
  if (sent < 0)
    return -1;
  packet->length -= sent;
  if (!packet->length)
    fio_sock_packet_rotate_unsafe(fd);
  return sent;
}